

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O1

int mbedtls_asn1_write_tagged_string(uchar **p,uchar *start,int tag,char *text,size_t text_len)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  
  puVar1 = *p;
  uVar2 = 0xffffff94;
  if (text_len <= (ulong)((long)puVar1 - (long)start) && start <= puVar1) {
    *p = puVar1 + -text_len;
    memcpy(puVar1 + -text_len,text,text_len);
    uVar2 = (uint)text_len;
  }
  if (-1 < (int)uVar2) {
    iVar3 = mbedtls_asn1_write_len_and_tag(p,start,(ulong)uVar2,(uchar)tag);
    return iVar3;
  }
  return uVar2;
}

Assistant:

int mbedtls_asn1_write_tagged_string(unsigned char **p, const unsigned char *start, int tag,
                                     const char *text, size_t text_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start,
                                                            (const unsigned char *) text,
                                                            text_len));

    return mbedtls_asn1_write_len_and_tag(p, start, len, tag);
}